

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

void COVER_tryParameters(void *opaque)

{
  ZDICT_cover_params_t *pZVar1;
  COVER_ctx_t *ctx;
  size_t __size;
  uint uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ZDICT_cover_params_t parameters_00;
  COVER_dictSelection_t selection;
  ZDICT_cover_params_t params;
  ZDICT_cover_params_t parameters_01;
  uint uVar5;
  void *dictBuffer;
  U32 *freqs;
  COVER_map_pair_t *__s;
  size_t sVar6;
  ulong uVar7;
  BYTE *__ptr;
  size_t __size_00;
  ZDICT_cover_params_t parameters;
  COVER_dictSelection_t ds;
  undefined4 in_stack_fffffffffffffeec;
  undefined8 in_stack_fffffffffffffef0;
  undefined8 in_stack_fffffffffffffef8;
  undefined8 in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  size_t in_stack_ffffffffffffff38;
  int local_98;
  int iStack_94;
  COVER_dictSelection_t local_68;
  COVER_map_t local_48;
  
  ctx = *opaque;
  pZVar1 = (ZDICT_cover_params_t *)((long)opaque + 0x18);
  uVar3 = pZVar1->k;
  uVar4 = pZVar1->d;
  parameters_01 = *pZVar1;
  params = *pZVar1;
  __size = *(size_t *)((long)opaque + 0x10);
  dictBuffer = malloc(__size);
  local_68.dictContent = (BYTE *)0x0;
  local_68.dictSize = 0;
  local_68.totalCompressedSize = 0xffffffffffffffff;
  __size_00 = ctx->suffixSize << 2;
  freqs = (U32 *)malloc(__size_00);
  uVar5 = (uVar3 - uVar4) + 1;
  uVar2 = 0x1f;
  if (uVar5 != 0) {
    for (; uVar5 >> uVar2 == 0; uVar2 = uVar2 - 1) {
    }
  }
  local_48.sizeLog = (uVar2 ^ 0xffffffe0) + 0x22;
  local_48.size = 4 << ((byte)uVar2 & 0x1f);
  uVar7 = (ulong)local_48.size;
  local_48.sizeMask = local_48.size - 1;
  __s = (COVER_map_pair_t *)malloc(uVar7 << 3);
  local_48.data = __s;
  if (__s == (COVER_map_pair_t *)0x0) {
    if (g_displayLevel < 1) {
      __ptr = (BYTE *)0x0;
      goto LAB_00186aaf;
    }
    COVER_tryParameters_cold_3();
    __ptr = (BYTE *)0x0;
  }
  else {
    memset(__s,0xff,uVar7 << 3);
    if ((dictBuffer == (void *)0x0) || (freqs == (U32 *)0x0)) {
      if (g_displayLevel < 1) {
        __ptr = (BYTE *)0x0;
        goto LAB_00186aaf;
      }
      COVER_tryParameters_cold_1();
      __ptr = (BYTE *)0x0;
    }
    else {
      memcpy(freqs,ctx->freqs,__size_00);
      parameters_00.d = in_stack_fffffffffffffeec;
      parameters_00.k = uVar4;
      parameters_00.steps = (int)in_stack_fffffffffffffef0;
      parameters_00.nbThreads = (int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
      parameters_00.splitPoint = (double)in_stack_fffffffffffffef8;
      parameters_00.shrinkDict = (int)in_stack_ffffffffffffff00;
      parameters_00.shrinkDictMaxRegression = (int)((ulong)in_stack_ffffffffffffff00 >> 0x20);
      parameters_00.zParams.compressionLevel = (int)in_stack_ffffffffffffff08;
      parameters_00.zParams.notificationLevel = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
      parameters_00._40_8_ = in_stack_ffffffffffffff10;
      sVar6 = COVER_buildDictionary(ctx,freqs,&local_48,dictBuffer,__size,parameters_00);
      COVER_selectDict(&local_68,(BYTE *)((long)dictBuffer + sVar6),__size,__size - sVar6,
                       ctx->samples,ctx->samplesSizes,(uint)ctx->nbTrainSamples,ctx->nbTrainSamples,
                       ctx->nbSamples,params,ctx->offsets,in_stack_ffffffffffffff38);
      __ptr = local_68.dictContent;
      if ((local_68.dictContent != (BYTE *)0x0 && local_68.totalCompressedSize < 0xffffffffffffff89)
         || (g_displayLevel < 1)) goto LAB_00186aaf;
      COVER_tryParameters_cold_2();
    }
  }
  fflush(_stderr);
LAB_00186aaf:
  free(dictBuffer);
  selection.dictSize = local_68.dictSize;
  selection.dictContent = local_68.dictContent;
  selection.totalCompressedSize = local_68.totalCompressedSize;
  COVER_best_finish(*(COVER_best_t **)((long)opaque + 8),parameters_01,selection);
  free(opaque);
  if (__s != (COVER_map_pair_t *)0x0) {
    free(__s);
  }
  free(__ptr);
  free(freqs);
  return;
}

Assistant:

static void COVER_tryParameters(void *opaque)
{
  /* Save parameters as local variables */
  COVER_tryParameters_data_t *const data = (COVER_tryParameters_data_t*)opaque;
  const COVER_ctx_t *const ctx = data->ctx;
  const ZDICT_cover_params_t parameters = data->parameters;
  size_t dictBufferCapacity = data->dictBufferCapacity;
  size_t totalCompressedSize = ERROR(GENERIC);
  /* Allocate space for hash table, dict, and freqs */
  COVER_map_t activeDmers;
  BYTE* const dict = (BYTE*)malloc(dictBufferCapacity);
  COVER_dictSelection_t selection = COVER_dictSelectionError(ERROR(GENERIC));
  U32* const freqs = (U32*)malloc(ctx->suffixSize * sizeof(U32));
  if (!COVER_map_init(&activeDmers, parameters.k - parameters.d + 1)) {
    DISPLAYLEVEL(1, "Failed to allocate dmer map: out of memory\n");
    goto _cleanup;
  }
  if (!dict || !freqs) {
    DISPLAYLEVEL(1, "Failed to allocate buffers: out of memory\n");
    goto _cleanup;
  }
  /* Copy the frequencies because we need to modify them */
  memcpy(freqs, ctx->freqs, ctx->suffixSize * sizeof(U32));
  /* Build the dictionary */
  {
    const size_t tail = COVER_buildDictionary(ctx, freqs, &activeDmers, dict,
                                              dictBufferCapacity, parameters);
    selection = COVER_selectDict(dict + tail, dictBufferCapacity, dictBufferCapacity - tail,
        ctx->samples, ctx->samplesSizes, (unsigned)ctx->nbTrainSamples, ctx->nbTrainSamples, ctx->nbSamples, parameters, ctx->offsets,
        totalCompressedSize);

    if (COVER_dictSelectionIsError(selection)) {
      DISPLAYLEVEL(1, "Failed to select dictionary\n");
      goto _cleanup;
    }
  }
_cleanup:
  free(dict);
  COVER_best_finish(data->best, parameters, selection);
  free(data);
  COVER_map_destroy(&activeDmers);
  COVER_dictSelectionFree(selection);
  free(freqs);
}